

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_comm.cpp
# Opt level: O1

void __thiscall Omega_h::Comm::Comm(Comm *this)

{
  (this->host_srcs_).read_.write_.shared_alloc_.direct_ptr = (void *)0x0;
  (this->host_dsts_).read_.write_.shared_alloc_.alloc = (Alloc *)0x0;
  (this->dsts_).write_.shared_alloc_.direct_ptr = (void *)0x0;
  (this->host_srcs_).read_.write_.shared_alloc_.alloc = (Alloc *)0x0;
  (this->srcs_).write_.shared_alloc_.direct_ptr = (void *)0x0;
  (this->dsts_).write_.shared_alloc_.alloc = (Alloc *)0x0;
  this->library_ = (Library *)0x0;
  (this->srcs_).write_.shared_alloc_.alloc = (Alloc *)0x0;
  (this->host_dsts_).read_.write_.shared_alloc_.direct_ptr = (void *)0x0;
  return;
}

Assistant:

Comm::Comm() {
#ifdef OMEGA_H_USE_MPI
  impl_ = MPI_COMM_NULL;
#endif
  library_ = nullptr;
}